

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_bar.cpp
# Opt level: O3

void __thiscall
duckdb::ProgressBar::ProgressBar
          (ProgressBar *this,Executor *executor,idx_t show_progress_after,
          progress_bar_display_create_func_t create_display_func)

{
  _Head_base<0UL,_duckdb::ProgressBarDisplay_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ProgressBarDisplay_*,_false> _Var2;
  ProgressBarDisplay *in_RAX;
  _Head_base<0UL,_duckdb::ProgressBarDisplay_*,_false> local_18;
  
  this->executor = executor;
  (this->profiler).start.__d.__r = 0;
  (this->profiler).end.__d.__r = 0;
  (this->profiler).finished = false;
  this->show_progress_after = show_progress_after;
  local_18._M_head_impl = in_RAX;
  QueryProgress::QueryProgress(&this->query_progress);
  (this->display).
  super_unique_ptr<duckdb::ProgressBarDisplay,_std::default_delete<duckdb::ProgressBarDisplay>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ProgressBarDisplay,_std::default_delete<duckdb::ProgressBarDisplay>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ProgressBarDisplay_*,_std::default_delete<duckdb::ProgressBarDisplay>_>
  .super__Head_base<0UL,_duckdb::ProgressBarDisplay_*,_false>._M_head_impl =
       (ProgressBarDisplay *)0x0;
  this->supported = true;
  this->finished = false;
  if (create_display_func != (progress_bar_display_create_func_t)0x0) {
    (*create_display_func)(&local_18);
    _Var2._M_head_impl = local_18._M_head_impl;
    local_18._M_head_impl = (ProgressBarDisplay *)0x0;
    _Var1._M_head_impl =
         (this->display).
         super_unique_ptr<duckdb::ProgressBarDisplay,_std::default_delete<duckdb::ProgressBarDisplay>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::ProgressBarDisplay,_std::default_delete<duckdb::ProgressBarDisplay>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ProgressBarDisplay_*,_std::default_delete<duckdb::ProgressBarDisplay>_>
         .super__Head_base<0UL,_duckdb::ProgressBarDisplay_*,_false>._M_head_impl;
    (this->display).
    super_unique_ptr<duckdb::ProgressBarDisplay,_std::default_delete<duckdb::ProgressBarDisplay>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::ProgressBarDisplay,_std::default_delete<duckdb::ProgressBarDisplay>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ProgressBarDisplay_*,_std::default_delete<duckdb::ProgressBarDisplay>_>
    .super__Head_base<0UL,_duckdb::ProgressBarDisplay_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (ProgressBarDisplay *)0x0) {
      (*(_Var1._M_head_impl)->_vptr_ProgressBarDisplay[1])();
      if (local_18._M_head_impl != (ProgressBarDisplay *)0x0) {
        (*(local_18._M_head_impl)->_vptr_ProgressBarDisplay[1])();
      }
    }
  }
  return;
}

Assistant:

ProgressBar::ProgressBar(Executor &executor, idx_t show_progress_after,
                         progress_bar_display_create_func_t create_display_func)
    : executor(executor), show_progress_after(show_progress_after) {
	if (create_display_func) {
		display = create_display_func();
	}
}